

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTextureImplFBO.cpp
# Opt level: O1

bool __thiscall
sf::priv::RenderTextureImplFBO::create
          (RenderTextureImplFBO *this,uint width,uint height,uint textureId,
          ContextSettings *settings)

{
  bool bVar1;
  ostream *poVar2;
  long *plVar3;
  Uint64 UVar4;
  GLuint GVar5;
  TransientContextLock lock;
  GLint readFramebuffer;
  GLint drawFramebuffer;
  TransientContextLock local_39;
  GLuint local_38;
  GLuint local_34;
  
  this->m_width = width;
  this->m_height = height;
  GlResource::TransientContextLock::TransientContextLock(&local_39);
  ensureExtensionsInit();
  if (((settings->antialiasingLevel == 0) ||
      ((sfogl_ext_EXT_framebuffer_multisample != 0 && (sfogl_ext_EXT_framebuffer_blit != 0)))) &&
     ((settings->stencilBits == 0 || (sfogl_ext_EXT_packed_depth_stencil != 0)))) {
    if (settings->antialiasingLevel != 0) {
      local_38 = 0;
      glGetIntegerv(0x8d57);
      glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                   ,0xed,"glGetIntegerv(GLEXT_GL_MAX_SAMPLES, &samples)");
      if (local_38 < settings->antialiasingLevel) {
        poVar2 = err();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar2,"Impossible to create render texture (unsupported anti-aliasing level)",
                   0x45);
        poVar2 = err();
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," Requested: ",0xc);
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," Maximum supported: ",0x14);
        plVar3 = (long *)std::ostream::operator<<(poVar2,local_38);
        std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
        std::ostream::put((char)plVar3);
        std::ostream::flush();
        goto LAB_0013a4ca;
      }
    }
    if (settings->antialiasingLevel == 0) {
      if (settings->stencilBits == 0) {
        if (settings->depthBits == 0) goto LAB_0013a3f7;
        local_38 = 0;
        (*sf_ptrc_glGenRenderbuffersEXT)(1,&local_38);
        glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                     ,0x11a,"GLEXT_glGenRenderbuffers(1, &depthStencil)");
        GVar5 = local_38;
        this->m_depthStencilBuffer = local_38;
        if (local_38 == 0) {
          poVar2 = err();
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar2,
                     "Impossible to create render texture (failed to create the attached depth buffer)"
                     ,0x50);
          std::endl<char,std::char_traits<char>>(poVar2);
        }
        else {
          (*sf_ptrc_glBindRenderbufferEXT)(0x8d41,local_38);
          glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                       ,0x121,
                       "GLEXT_glBindRenderbuffer(GLEXT_GL_RENDERBUFFER, m_depthStencilBuffer)");
          (*sf_ptrc_glRenderbufferStorageEXT)(0x8d41,0x1902,width,height);
          glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                       ,0x122,
                       "GLEXT_glRenderbufferStorage(GLEXT_GL_RENDERBUFFER, GLEXT_GL_DEPTH_COMPONENT, width, height)"
                      );
        }
      }
      else {
        local_38 = 0;
        (*sf_ptrc_glGenRenderbuffersEXT)(1,&local_38);
        glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                     ,0x103,"GLEXT_glGenRenderbuffers(1, &depthStencil)");
        GVar5 = local_38;
        this->m_depthStencilBuffer = local_38;
        if (local_38 == 0) {
          poVar2 = err();
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar2,
                     "Impossible to create render texture (failed to create the attached depth/stencil buffer)"
                     ,0x58);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
          std::ostream::put((char)poVar2);
          std::ostream::flush();
        }
        else {
          (*sf_ptrc_glBindRenderbufferEXT)(0x8d41,local_38);
          glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                       ,0x10a,
                       "GLEXT_glBindRenderbuffer(GLEXT_GL_RENDERBUFFER, m_depthStencilBuffer)");
          (*sf_ptrc_glRenderbufferStorageEXT)(0x8d41,0x88f0,width,height);
          glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                       ,0x10b,
                       "GLEXT_glRenderbufferStorage(GLEXT_GL_RENDERBUFFER, GLEXT_GL_DEPTH24_STENCIL8, width, height)"
                      );
          this->m_stencil = true;
        }
      }
      if (GVar5 == 0) goto LAB_0013a4ca;
    }
    else {
      local_38 = 0;
      (*sf_ptrc_glGenRenderbuffersEXT)(1,&local_38);
      glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                   ,300,"GLEXT_glGenRenderbuffers(1, &color)");
      this->m_colorBuffer = local_38;
      if (local_38 == 0) {
        poVar2 = err();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar2,
                   "Impossible to create render texture (failed to create the attached multisample color buffer)"
                   ,0x5c);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        goto LAB_0013a4ca;
      }
      (*sf_ptrc_glBindRenderbufferEXT)(0x8d41,local_38);
      glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                   ,0x133,"GLEXT_glBindRenderbuffer(GLEXT_GL_RENDERBUFFER, m_colorBuffer)");
      (*sf_ptrc_glRenderbufferStorageMultisampleEXT)
                (0x8d41,settings->antialiasingLevel,0x1908,width,height);
      glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                   ,0x134,
                   "GLEXT_glRenderbufferStorageMultisample(GLEXT_GL_RENDERBUFFER, settings.antialiasingLevel, GL_RGBA, width, height)"
                  );
      if (settings->stencilBits == 0) {
        if (settings->depthBits != 0) {
          local_34 = 0;
          (*sf_ptrc_glGenRenderbuffersEXT)(1,&local_34);
          glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                       ,0x149,"GLEXT_glGenRenderbuffers(1, &depthStencil)");
          GVar5 = local_34;
          this->m_depthStencilBuffer = local_34;
          if (local_34 == 0) {
            poVar2 = err();
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar2,
                       "Impossible to create render texture (failed to create the attached multisample depth buffer)"
                       ,0x5c);
            std::endl<char,std::char_traits<char>>(poVar2);
          }
          else {
            (*sf_ptrc_glBindRenderbufferEXT)(0x8d41,local_34);
            glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                         ,0x150,
                         "GLEXT_glBindRenderbuffer(GLEXT_GL_RENDERBUFFER, m_depthStencilBuffer)");
            (*sf_ptrc_glRenderbufferStorageMultisampleEXT)
                      (0x8d41,settings->antialiasingLevel,0x1902,width,height);
            glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                         ,0x151,
                         "GLEXT_glRenderbufferStorageMultisample(GLEXT_GL_RENDERBUFFER, settings.antialiasingLevel, GLEXT_GL_DEPTH_COMPONENT, width, height)"
                        );
          }
          goto LAB_0013a3b8;
        }
      }
      else {
        local_34 = 0;
        (*sf_ptrc_glGenRenderbuffersEXT)(1,&local_34);
        glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                     ,0x13a,"GLEXT_glGenRenderbuffers(1, &depthStencil)");
        GVar5 = local_34;
        this->m_depthStencilBuffer = local_34;
        if (local_34 == 0) {
          poVar2 = err();
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar2,
                     "Impossible to create render texture (failed to create the attached multisample depth/stencil buffer)"
                     ,100);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
          std::ostream::put((char)poVar2);
          std::ostream::flush();
        }
        else {
          (*sf_ptrc_glBindRenderbufferEXT)(0x8d41,local_34);
          glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                       ,0x141,
                       "GLEXT_glBindRenderbuffer(GLEXT_GL_RENDERBUFFER, m_depthStencilBuffer)");
          (*sf_ptrc_glRenderbufferStorageMultisampleEXT)
                    (0x8d41,settings->antialiasingLevel,0x88f0,width,height);
          glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                       ,0x142,
                       "GLEXT_glRenderbufferStorageMultisample(GLEXT_GL_RENDERBUFFER, settings.antialiasingLevel, GLEXT_GL_DEPTH24_STENCIL8, width, height)"
                      );
          this->m_stencil = true;
        }
LAB_0013a3b8:
        if (GVar5 == 0) goto LAB_0013a4ca;
      }
      this->m_multisample = true;
    }
LAB_0013a3f7:
    GlResource::TransientContextLock::~TransientContextLock(&local_39);
    this->m_textureId = textureId;
    UVar4 = Context::getActiveContextId();
    if (UVar4 == 0) {
      bVar1 = true;
    }
    else {
      local_38 = 0;
      local_34 = 0;
      glGetIntegerv(0x8caa);
      glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                   ,0x16d,"glGetIntegerv(GLEXT_GL_READ_FRAMEBUFFER_BINDING, &readFramebuffer)");
      glGetIntegerv(0x8ca6,&local_34);
      glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                   ,0x16e,"glGetIntegerv(GLEXT_GL_DRAW_FRAMEBUFFER_BINDING, &drawFramebuffer)");
      bVar1 = createFrameBuffer(this);
      if (bVar1) {
        (*sf_ptrc_glBindFramebufferEXT)(0x8ca8,local_38);
        glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                     ,0x173,"GLEXT_glBindFramebuffer(GLEXT_GL_READ_FRAMEBUFFER, readFramebuffer)");
        (*sf_ptrc_glBindFramebufferEXT)(0x8ca9,local_34);
        glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                     ,0x174,"GLEXT_glBindFramebuffer(GLEXT_GL_DRAW_FRAMEBUFFER, drawFramebuffer)");
      }
    }
  }
  else {
LAB_0013a4ca:
    GlResource::TransientContextLock::~TransientContextLock(&local_39);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool RenderTextureImplFBO::create(unsigned int width, unsigned int height, unsigned int textureId, const ContextSettings& settings)
{
    // Store the dimensions
    m_width = width;
    m_height = height;

    {
        TransientContextLock lock;

        // Make sure that extensions are initialized
        priv::ensureExtensionsInit();

        if (settings.antialiasingLevel && !(GLEXT_framebuffer_multisample && GLEXT_framebuffer_blit))
            return false;

        if (settings.stencilBits && !GLEXT_packed_depth_stencil)
            return false;

#ifndef SFML_OPENGL_ES

        // Check if the requested anti-aliasing level is supported
        if (settings.antialiasingLevel)
        {
            GLint samples = 0;
            glCheck(glGetIntegerv(GLEXT_GL_MAX_SAMPLES, &samples));

            if (settings.antialiasingLevel > static_cast<unsigned int>(samples))
            {
                err() << "Impossible to create render texture (unsupported anti-aliasing level)";
                err() << " Requested: " << settings.antialiasingLevel << " Maximum supported: " << samples << std::endl;
                return false;
            }
        }

#endif


        if (!settings.antialiasingLevel)
        {
            // Create the depth/stencil buffer if requested
            if (settings.stencilBits)
            {

#ifndef SFML_OPENGL_ES

                GLuint depthStencil = 0;
                glCheck(GLEXT_glGenRenderbuffers(1, &depthStencil));
                m_depthStencilBuffer = static_cast<unsigned int>(depthStencil);
                if (!m_depthStencilBuffer)
                {
                    err() << "Impossible to create render texture (failed to create the attached depth/stencil buffer)" << std::endl;
                    return false;
                }
                glCheck(GLEXT_glBindRenderbuffer(GLEXT_GL_RENDERBUFFER, m_depthStencilBuffer));
                glCheck(GLEXT_glRenderbufferStorage(GLEXT_GL_RENDERBUFFER, GLEXT_GL_DEPTH24_STENCIL8, width, height));

#else

                err() << "Impossible to create render texture (failed to create the attached depth/stencil buffer)" << std::endl;
                return false;

#endif // SFML_OPENGL_ES

                m_stencil = true;

            }
            else if (settings.depthBits)
            {
                GLuint depthStencil = 0;
                glCheck(GLEXT_glGenRenderbuffers(1, &depthStencil));
                m_depthStencilBuffer = static_cast<unsigned int>(depthStencil);
                if (!m_depthStencilBuffer)
                {
                    err() << "Impossible to create render texture (failed to create the attached depth buffer)" << std::endl;
                    return false;
                }
                glCheck(GLEXT_glBindRenderbuffer(GLEXT_GL_RENDERBUFFER, m_depthStencilBuffer));
                glCheck(GLEXT_glRenderbufferStorage(GLEXT_GL_RENDERBUFFER, GLEXT_GL_DEPTH_COMPONENT, width, height));
            }
        }
        else
        {

#ifndef SFML_OPENGL_ES

            // Create the multisample color buffer
            GLuint color = 0;
            glCheck(GLEXT_glGenRenderbuffers(1, &color));
            m_colorBuffer = static_cast<unsigned int>(color);
            if (!m_colorBuffer)
            {
                err() << "Impossible to create render texture (failed to create the attached multisample color buffer)" << std::endl;
                return false;
            }
            glCheck(GLEXT_glBindRenderbuffer(GLEXT_GL_RENDERBUFFER, m_colorBuffer));
            glCheck(GLEXT_glRenderbufferStorageMultisample(GLEXT_GL_RENDERBUFFER, settings.antialiasingLevel, GL_RGBA, width, height));

            // Create the multisample depth/stencil buffer if requested
            if (settings.stencilBits)
            {
                GLuint depthStencil = 0;
                glCheck(GLEXT_glGenRenderbuffers(1, &depthStencil));
                m_depthStencilBuffer = static_cast<unsigned int>(depthStencil);
                if (!m_depthStencilBuffer)
                {
                    err() << "Impossible to create render texture (failed to create the attached multisample depth/stencil buffer)" << std::endl;
                    return false;
                }
                glCheck(GLEXT_glBindRenderbuffer(GLEXT_GL_RENDERBUFFER, m_depthStencilBuffer));
                glCheck(GLEXT_glRenderbufferStorageMultisample(GLEXT_GL_RENDERBUFFER, settings.antialiasingLevel, GLEXT_GL_DEPTH24_STENCIL8, width, height));

                m_stencil = true;
            }
            else if (settings.depthBits)
            {
                GLuint depthStencil = 0;
                glCheck(GLEXT_glGenRenderbuffers(1, &depthStencil));
                m_depthStencilBuffer = static_cast<unsigned int>(depthStencil);
                if (!m_depthStencilBuffer)
                {
                    err() << "Impossible to create render texture (failed to create the attached multisample depth buffer)" << std::endl;
                    return false;
                }
                glCheck(GLEXT_glBindRenderbuffer(GLEXT_GL_RENDERBUFFER, m_depthStencilBuffer));
                glCheck(GLEXT_glRenderbufferStorageMultisample(GLEXT_GL_RENDERBUFFER, settings.antialiasingLevel, GLEXT_GL_DEPTH_COMPONENT, width, height));
            }

#else

            err() << "Impossible to create render texture (failed to create the multisample render buffers)" << std::endl;
            return false;

#endif // SFML_OPENGL_ES

            m_multisample = true;

        }
    }

    // Save our texture ID in order to be able to attach it to an FBO at any time
    m_textureId = textureId;

    // We can't create an FBO now if there is no active context
    if (!Context::getActiveContextId())
        return true;

#ifndef SFML_OPENGL_ES

    // Save the current bindings so we can restore them after we are done
    GLint readFramebuffer = 0;
    GLint drawFramebuffer = 0;

    glCheck(glGetIntegerv(GLEXT_GL_READ_FRAMEBUFFER_BINDING, &readFramebuffer));
    glCheck(glGetIntegerv(GLEXT_GL_DRAW_FRAMEBUFFER_BINDING, &drawFramebuffer));

    if (createFrameBuffer())
    {
        // Restore previously bound framebuffers
        glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_READ_FRAMEBUFFER, readFramebuffer));
        glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_DRAW_FRAMEBUFFER, drawFramebuffer));

        return true;
    }

#else

    // Save the current binding so we can restore them after we are done
    GLint frameBuffer = 0;

    glCheck(glGetIntegerv(GLEXT_GL_FRAMEBUFFER_BINDING, &frameBuffer));

    if (createFrameBuffer())
    {
        // Restore previously bound framebuffer
        glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_FRAMEBUFFER, frameBuffer));

        return true;
    }

#endif

    return false;
}